

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O1

size_t Imf_3_4::anon_unknown_4::getVariableLengthIntegerSize(uint64_t value)

{
  size_t sVar1;
  
  sVar1 = 1;
  if (((((0x7f < value) && (sVar1 = 2, 0x3fff < value)) && (sVar1 = 3, 0x1fffff < value)) &&
      ((sVar1 = 4, 0xfffffff < value && (sVar1 = 5, value >> 0x23 != 0)))) &&
     ((sVar1 = 6, value >> 0x2a != 0 &&
      ((sVar1 = 7, value >> 0x31 != 0 && (sVar1 = 8, value >> 0x38 != 0)))))) {
    sVar1 = 9 - ((long)value >> 0x3f);
  }
  return sVar1;
}

Assistant:

size_t
getVariableLengthIntegerSize (uint64_t value)
{

    if (value < 1llu << 7) { return 1; }

    if (value < 1llu << 14) { return 2; }
    if (value < 1llu << 21) { return 3; }
    if (value < 1llu << 28) { return 4; }
    if (value < 1llu << 35) { return 5; }
    if (value < 1llu << 42) { return 6; }
    if (value < 1llu << 49) { return 7; }
    if (value < 1llu << 56) { return 8; }
    if (value < 1llu << 63) { return 9; }
    return 10;
}